

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O0

uint32 Js::ES5Array::ToLengthValue(Var value,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *this;
  double dVar2;
  uint32 newLen_1;
  int32 newLen;
  ScriptContext *scriptContext_local;
  Var value_local;
  
  bVar1 = TaggedInt::Is(value);
  if (bVar1) {
    value_local._4_4_ = TaggedInt::ToInt32(value);
    if ((int)value_local._4_4_ < 0) {
      JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5a,(PCWSTR)0x0);
    }
  }
  else {
    value_local._4_4_ = JavascriptConversion::ToUInt32(value,scriptContext);
    dVar2 = JavascriptConversion::ToNumber(value,scriptContext);
    if (((double)value_local._4_4_ != dVar2) || (NAN((double)value_local._4_4_) || NAN(dVar2))) {
      JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5a,(PCWSTR)0x0);
    }
    this = ScriptContext::GetThreadContext(scriptContext);
    ThreadContext::AddImplicitCallFlags(this,ImplicitCall_Accessor);
  }
  return value_local._4_4_;
}

Assistant:

uint32 ES5Array::ToLengthValue(Var value, ScriptContext* scriptContext)
    {
        if (TaggedInt::Is(value))
        {
            int32 newLen = TaggedInt::ToInt32(value);
            if (newLen < 0)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
            }
            return static_cast<uint32>(newLen);
        }
        else
        {
            uint32 newLen = JavascriptConversion::ToUInt32(value, scriptContext);
            if (newLen != JavascriptConversion::ToNumber(value, scriptContext))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
            }

            // Conversion can change the type (e.g. from String), invalidating assumptions made by the JIT
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);

            return newLen;
        }
    }